

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIScrollBar::~CGUIScrollBar(CGUIScrollBar *this)

{
  CGUIScrollBar *in_RDI;
  
  ~CGUIScrollBar(in_RDI);
  operator_delete(in_RDI,0x1a0);
  return;
}

Assistant:

CGUIScrollBar::~CGUIScrollBar()
{
	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}